

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O3

void __thiscall Tree::reverseQuickSort(Tree *this,int L,int R)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pvVar4;
  pointer prVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  int iVar10;
  int R_00;
  int iVar11;
  pointer *pprVar12;
  pointer *pprVar13;
  long lVar14;
  pointer *pprVar15;
  pointer *pprVar16;
  long lVar17;
  int __tmp;
  
  do {
    R_00 = R;
    iVar11 = L;
    if (L <= R) {
      piVar3 = (this->m_weightArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar3[(L + R) / 2];
      pvVar4 = (this->m_vectorArray).
               super__Vector_base<std::vector<record,_std::allocator<record>_>,_std::allocator<std::vector<record,_std::allocator<record>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        lVar14 = (long)iVar11 + -1;
        pprVar13 = (pointer *)
                   ((long)&pvVar4[(long)iVar11 + -1].
                           super__Vector_base<record,_std::allocator<record>_>._M_impl.
                           super__Vector_impl_data + 0x10);
        iVar10 = iVar11;
        do {
          iVar11 = iVar10;
          pprVar12 = pprVar13;
          iVar2 = piVar3[lVar14 + 1];
          lVar14 = lVar14 + 1;
          pprVar13 = pprVar12 + 3;
          iVar10 = iVar11 + 1;
        } while (iVar1 < iVar2);
        lVar17 = (long)R_00 + 1;
        pprVar16 = (pointer *)
                   ((long)&pvVar4[(long)R_00 + 1].
                           super__Vector_base<record,_std::allocator<record>_>._M_impl.
                           super__Vector_impl_data + 0x10);
        iVar10 = R_00;
        do {
          R_00 = iVar10;
          pprVar15 = pprVar16;
          lVar9 = lVar17 + -1;
          lVar17 = lVar17 + -1;
          pprVar16 = pprVar15 + -3;
          iVar10 = R_00 + -1;
        } while (piVar3[lVar9] < iVar1);
        if (lVar14 <= lVar17) {
          piVar3[lVar14] = piVar3[lVar9];
          piVar3[lVar17] = iVar2;
          prVar5 = *pprVar13;
          *pprVar13 = *pprVar16;
          uVar6 = pprVar12[1];
          uVar7 = pprVar12[2];
          uVar8 = pprVar15[-4];
          pprVar12[1] = pprVar15[-5];
          pprVar12[2] = (pointer)uVar8;
          pprVar15[-5] = (pointer)uVar6;
          pprVar15[-4] = (pointer)uVar7;
          *pprVar16 = prVar5;
          R_00 = R_00 + -1;
          iVar11 = iVar11 + 1;
        }
      } while (iVar11 <= R_00);
    }
    if (L < R_00) {
      reverseQuickSort(this,L,R_00);
    }
    L = iVar11;
  } while (iVar11 < R);
  return;
}

Assistant:

void reverseQuickSort(int L, int R) {
        int i = L;
        int j = R;
        int temp = m_weightArray[(i + j) / 2];
        while (i <= j) {
            while (m_weightArray[i] > temp) {
                i++;
            }
            while (m_weightArray[j] < temp) {
                j--;
            }
            if (i <= j) {
                swap(m_weightArray[i], m_weightArray[j]);
                swap(m_vectorArray[i], m_vectorArray[j]);
                i++;
                j--;
            }
        }
        if (L < j) {
            reverseQuickSort(L, j);
        }
        if (i < R) {
            reverseQuickSort(i, R);
        }
    }